

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDDD.cpp
# Opt level: O3

void __thiscall chrono::fea::ChNodeFEAxyzDDD::NodeIntLoadResidual_Mv(ChNodeFEAxyzDDD *this)

{
  ChVectorDynamic<> *in_RCX;
  ChVectorDynamic<> *in_RDX;
  uint in_ESI;
  double in_XMM0_Qa;
  
  NodeIntLoadResidual_Mv
            ((ChNodeFEAxyzDDD *)
             ((long)&(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.
                     super_ChNodeFEAbase._vptr_ChNodeFEAbase +
             (long)(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.
                   super_ChNodeFEAbase._vptr_ChNodeFEAbase[-0xd]),in_ESI,in_RDX,in_RCX,in_XMM0_Qa);
  return;
}

Assistant:

void ChNodeFEAxyzDDD::NodeIntLoadResidual_Mv(const unsigned int off,
                                            ChVectorDynamic<>& R,
                                            const ChVectorDynamic<>& w,
                                            const double c) {
    R(off + 0) += c * GetMass() * w(off + 0);
    R(off + 1) += c * GetMass() * w(off + 1);
    R(off + 2) += c * GetMass() * w(off + 2);
    R(off + 3) += c * GetMassDiagonal()(0) * w(off + 3);  // unuseful? mass for D isalways zero..
    R(off + 4) += c * GetMassDiagonal()(1) * w(off + 4);
    R(off + 5) += c * GetMassDiagonal()(2) * w(off + 5);
    R(off + 6) += c * GetMassDiagonalDD()(0) * w(off + 6);
    R(off + 7) += c * GetMassDiagonalDD()(1) * w(off + 7);
    R(off + 8) += c * GetMassDiagonalDD()(2) * w(off + 8);
    R(off + 9) += c * GetMassDiagonalDDD()(0) * w(off + 9);
    R(off + 10) += c * GetMassDiagonalDDD()(1) * w(off + 10);
    R(off + 11) += c * GetMassDiagonalDDD()(2) * w(off + 11);
}